

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skin.cpp
# Opt level: O0

Stream * rw::readSkinLegacy(Stream *stream,int32 len,void *object,int32 param_4,int32 param_5)

{
  long lVar1;
  HAnimHierarchy *pHVar2;
  uint numNodes;
  int32 iVar3;
  uint uVar4;
  Skin *this;
  Frame *pFVar5;
  HAnimData *pHVar6;
  Frame *frame;
  Matrix mat;
  int i;
  HAnimHierarchy *hier;
  Skin *skin;
  int32 numVertices;
  int32 numBones;
  Geometry *geometry;
  Atomic *atomic;
  int32 param_4_local;
  int32 param_3_local;
  void *object_local;
  int32 len_local;
  Stream *stream_local;
  
  lVar1 = *(long *)((long)object + 0x28);
  numNodes = Stream::readI32(stream);
  iVar3 = Stream::readI32(stream);
  this = (Skin *)mustmalloc_LOC(0x70,0x30116,
                                "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/skin.cpp line: 265"
                               );
  *(Skin **)(lVar1 + skinGlobals) = this;
  Skin::init(this,(EVP_PKEY_CTX *)(ulong)numNodes);
  this->legacyType = 1;
  this->numWeights = 4;
  (*stream->_vptr_Stream[4])(stream,this->indices,(ulong)(uint)(iVar3 << 2));
  Stream::read32(stream,this->weights,iVar3 << 4);
  register0x00000000 = HAnimHierarchy::create(numNodes,(int32 *)0x0,(int32 *)0x0,0,0x24);
  for (mat.pos.z = 0.0; (int)mat.pos.z < (int)numNodes; mat.pos.z = (float32)((int)mat.pos.z + 1)) {
    iVar3 = Stream::readI32(stream);
    stack0xffffffffffffffb0->nodeInfo[(int)mat.pos.z].id = iVar3;
    iVar3 = Stream::readI32(stream);
    stack0xffffffffffffffb0->nodeInfo[(int)mat.pos.z].index = iVar3;
    uVar4 = Stream::readI32(stream);
    stack0xffffffffffffffb0->nodeInfo[(int)mat.pos.z].flags = uVar4 & 3;
    Stream::read32(stream,this->inverseMatrices + ((int)mat.pos.z << 4),0x40);
    Matrix::invert((Matrix *)((long)&frame + 4),
                   (Matrix *)(this->inverseMatrices + ((int)mat.pos.z << 4)));
  }
  pFVar5 = Atomic::getFrame((Atomic *)object);
  pHVar2 = stack0xffffffffffffffb0;
  pFVar5 = pFVar5->child;
  pHVar6 = HAnimData::get(pFVar5);
  pHVar6->hierarchy = pHVar2;
  stack0xffffffffffffffb0->parentFrame = pFVar5;
  return stream;
}

Assistant:

static Stream*
readSkinLegacy(Stream *stream, int32 len, void *object, int32, int32)
{
	Atomic *atomic = (Atomic*)object;
	Geometry *geometry = atomic->geometry;

	int32 numBones = stream->readI32();
	int32 numVertices = stream->readI32();
	assert(numVertices == geometry->numVertices);

	Skin *skin = rwNewT(Skin, 1, MEMDUR_EVENT | ID_SKIN);
	*PLUGINOFFSET(Skin*, geometry, skinGlobals.geoOffset) = skin;
	skin->init(numBones, numBones, numVertices);
	skin->legacyType = 1;
	skin->numWeights = 4;

	stream->read8(skin->indices, numVertices*4);
	stream->read32(skin->weights, numVertices*16);

	HAnimHierarchy *hier = HAnimHierarchy::create(numBones, nil, nil, 0, 36);

	for(int i = 0; i < numBones; i++){
		hier->nodeInfo[i].id = stream->readI32();
		hier->nodeInfo[i].index = stream->readI32();
		hier->nodeInfo[i].flags = stream->readI32() & 3;
//		printf("%d %d %d %d\n", i, hier->nodeInfo[i].id, hier->nodeInfo[i].index, hier->nodeInfo[i].flags);
		stream->read32(&skin->inverseMatrices[i*16], 64);

		Matrix mat;
		Matrix::invert(&mat, (Matrix*)&skin->inverseMatrices[i*16]);
//		printf("[ [ %8.4f, %8.4f, %8.4f, %8.4f ]\n"
//		       "  [ %8.4f, %8.4f, %8.4f, %8.4f ]\n"
//		       "  [ %8.4f, %8.4f, %8.4f, %8.4f ]\n"
//		       "  [ %8.4f, %8.4f, %8.4f, %8.4f ] ]\n"
//			"  %08x == flags\n",
//			mat.right.x, mat.up.x, mat.at.x, mat.pos.x,
//			mat.right.y, mat.up.y, mat.at.y, mat.pos.y,
//			mat.right.z, mat.up.z, mat.at.z, mat.pos.z,
//			0.0f, 0.0f, 0.0f, 1.0f,
//			mat.flags);
	}
	Frame *frame = atomic->getFrame()->child;
	assert(frame->next == nil);	// in old files atomic is above hierarchy it seems
	assert(frame->count() == numBones);	// assuming one frame per node this should also be true
	HAnimData::get(frame)->hierarchy = hier;
	hier->parentFrame = frame;

	return stream;
}